

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dependencies.h
# Opt level: O0

void __thiscall entityx::deps::Dependency<A,_B>::assign<B>(Dependency<A,_B> *this,Entity entity)

{
  bool bVar1;
  undefined8 local_38;
  
  Entity::component<B,void>(local_38);
  bVar1 = ComponentHandle::operator_cast_to_bool
                    ((ComponentHandle<B,_entityx::EntityManager> *)0x2b5141);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    Entity::assign<B>(local_38);
  }
  return;
}

Assistant:

void assign(Entity entity) {
    if (!entity.component<D>()) entity.assign<D>();
  }